

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeSets.cpp
# Opt level: O2

string * Lodtalk::getSistaBytecodeName_abi_cxx11_(int bytecode)

{
  int i;
  ulong uVar1;
  long lVar2;
  char buffer [64];
  allocator local_89;
  char local_88 [64];
  value_type local_48;
  
  if (sistaByteCodeNames_abi_cxx11_ == DAT_00173fa8) {
    std::__cxx11::string::string((string *)&local_48,"unssuported",&local_89);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sistaByteCodeNames_abi_cxx11_,0x100,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    lVar2 = 0;
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PushReceiverVariableShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x200;
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PushLiteralVariableShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x400;
    for (uVar1 = 0; uVar1 != 0x20; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PushLiteralShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x800;
    for (uVar1 = 0; uVar1 != 0xc; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PushTempShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x980));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x9a0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x9c0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x9e0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xa00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xa20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xa40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xa60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xb00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xb20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xb40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xb60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xb80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xba0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xbc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xbe0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xc00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xc20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xc40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xc60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xc80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xca0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xcc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xce0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xd00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xd20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xd40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xd60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xd80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xda0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xdc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xde0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xe00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xe20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xe40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xe60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xe80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xea0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xec0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xee0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xf20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xf40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xf60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xf80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 4000));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xfc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0xfe0));
    lVar2 = 0x1000;
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      sprintf(local_88,"SendShortArgs0: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1200;
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      sprintf(local_88,"SendShortArgs1: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1400;
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      sprintf(local_88,"SendShortArgs2: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1600;
    for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
      sprintf(local_88,"JumpShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1700;
    for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
      sprintf(local_88,"JumpOnTrueShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1800;
    for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
      sprintf(local_88,"JumpOnFalseShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1900;
    for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PopStoreReceiverVariableShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    lVar2 = 0x1a00;
    for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
      sprintf(local_88,"PopStoreTemporalVariableShort: %d",uVar1 & 0xffffffff);
      std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1b00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1c00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1c20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1c40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1c60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1c80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1ca0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1cc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1ce0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1d00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1d20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1d40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1d60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1d80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1da0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1dc0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1de0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1e00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1e20));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1e40));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1e60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1e80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1ea0));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1f00));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 8000));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1f60));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1f80));
    std::__cxx11::string::assign((char *)(sistaByteCodeNames_abi_cxx11_ + 0x1fa0));
  }
  return (string *)((long)bytecode * 0x20 + sistaByteCodeNames_abi_cxx11_);
}

Assistant:

const std::string &getSistaBytecodeName(int bytecode)
{
    if(sistaByteCodeNames.empty())
    {
        char buffer[64];
        sistaByteCodeNames.resize(256, "unssuported");

        #define SISTAV1_INSTRUCTION_RANGE(name, range_first, range_end) \
        for(int i = range_first; i <= range_end; ++i) {\
            sprintf(buffer, #name ": %d", i - range_first); \
            sistaByteCodeNames[i] = buffer; \
        }
        #define SISTAV1_INSTRUCTION(name, opcode) \
            sistaByteCodeNames[opcode] = #name;

        #include "SistaV1BytecodeSet.inc"

        #undef SISTAV1_INSTRUCTION_RANGE
        #undef SISTAV1_INSTRUCTION

    }

    return sistaByteCodeNames[bytecode];
}